

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O1

MockActualCall_c * withActualOutputParameterOfType_c(char *type,char *name,void *value)

{
  MockActualCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  SimpleString SStack_38;
  SimpleString local_28;
  
  pMVar1 = actualCall;
  SimpleString::SimpleString(&local_28,type);
  SimpleString::SimpleString(&SStack_38,name);
  iVar2 = (*pMVar1->_vptr_MockActualCall[6])(pMVar1,&local_28,&SStack_38,value);
  actualCall = (MockActualCall *)CONCAT44(extraout_var,iVar2);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  return &gActualCall;
}

Assistant:

MockActualCall_c* withActualOutputParameterOfType_c(const char* type, const char* name, void* value)
{
    actualCall = &actualCall->withOutputParameterOfType(type, name, value);
    return &gActualCall;
}